

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlCtxtReadFile(void)

{
  int val;
  htmlParserCtxtPtr val_00;
  char *val_01;
  char *val_02;
  htmlDocPtr val_03;
  undefined4 local_4c;
  int n_options;
  int options;
  int n_encoding;
  char *encoding;
  int n_filename;
  char *filename;
  int n_ctxt;
  htmlParserCtxtPtr ctxt;
  htmlDocPtr ret_val;
  int test_ret;
  
  for (filename._4_4_ = 0; filename._4_4_ < 3; filename._4_4_ = filename._4_4_ + 1) {
    for (encoding._4_4_ = 0; encoding._4_4_ < 8; encoding._4_4_ = encoding._4_4_ + 1) {
      for (n_options = 0; n_options < 4; n_options = n_options + 1) {
        for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
          val_00 = gen_htmlParserCtxtPtr(filename._4_4_,0);
          val_01 = gen_filepath(encoding._4_4_,1);
          val_02 = gen_const_char_ptr(n_options,2);
          val = gen_int(local_4c,3);
          val_03 = (htmlDocPtr)htmlCtxtReadFile(val_00,val_01,val_02,val);
          desret_htmlDocPtr(val_03);
          call_tests = call_tests + 1;
          des_htmlParserCtxtPtr(filename._4_4_,val_00,0);
          des_filepath(encoding._4_4_,val_01,1);
          des_const_char_ptr(n_options,val_02,2);
          des_int(local_4c,val,3);
          xmlResetLastError();
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_htmlCtxtReadFile(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    htmlDocPtr ret_val;
    htmlParserCtxtPtr ctxt; /* an HTML parser context */
    int n_ctxt;
    const char * filename; /* a file or URL */
    int n_filename;
    const char * encoding; /* the document encoding (optional) */
    int n_encoding;
    int options; /* a combination of htmlParserOptions */
    int n_options;

    for (n_ctxt = 0;n_ctxt < gen_nb_htmlParserCtxtPtr;n_ctxt++) {
    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_options = 0;n_options < gen_nb_int;n_options++) {
        ctxt = gen_htmlParserCtxtPtr(n_ctxt, 0);
        filename = gen_filepath(n_filename, 1);
        encoding = gen_const_char_ptr(n_encoding, 2);
        options = gen_int(n_options, 3);

        ret_val = htmlCtxtReadFile(ctxt, filename, encoding, options);
        desret_htmlDocPtr(ret_val);
        call_tests++;
        des_htmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_filepath(n_filename, filename, 1);
        des_const_char_ptr(n_encoding, encoding, 2);
        des_int(n_options, options, 3);
        xmlResetLastError();
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}